

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_kelvin.cc
# Opt level: O0

void __thiscall hwtest::pgraph::MthdKelvinDmaClipid::emulate_mthd(MthdKelvinDmaClipid *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  uint32_t uVar5;
  uint uVar6;
  uint uVar7;
  bool local_26;
  bool prot_err;
  bool bad;
  int mem;
  uint32_t dcls;
  uint32_t limit;
  uint32_t base;
  uint32_t offset_mask;
  MthdKelvinDmaClipid *this_local;
  
  uVar5 = pgraph_offset_mask(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.
                              super_RepeatTest.super_Test.chipset);
  uVar1 = (this->super_SingleMthdTest).super_MthdTest.pobj[2];
  uVar3 = (this->super_SingleMthdTest).super_MthdTest.pobj[0] >> 0x14;
  uVar2 = (this->super_SingleMthdTest).super_MthdTest.pobj[1];
  uVar7 = (uint)(((ulong)(this->super_SingleMthdTest).super_MthdTest.pobj[0] << 0x34) >> 0x34);
  uVar6 = (uint)(((ulong)(this->super_SingleMthdTest).super_MthdTest.pobj[0] << 0x2e) >> 0x3e);
  bVar4 = true;
  if ((uVar7 == 0x30) || (uVar7 == 0x3d)) {
    bVar4 = false;
  }
  if (((long)((ulong)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.debug_d << 0x28
             ) < 0) && (bVar4)) {
    nv04_pgraph_blowup(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,2);
  }
  local_26 = 1 < uVar6 || (uVar3 & 0xff) != 0;
  if ((uVar6 == 1) &&
     (0x3f < (this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test
             .chipset.card_type)) {
    local_26 = true;
  }
  if (uVar7 == 0x30) {
    local_26 = false;
  }
  if (local_26) {
    nv04_pgraph_blowup(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,4);
  }
  if ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource == 0) {
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_surf_limit_clipid =
         uVar2 & (uVar5 | 0x3f) | (uint)(uVar6 == 1) << 0x1e | (uint)(uVar7 != 0x30) << 0x1f;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_surf_base_clipid =
         (uVar1 & 0xfffff000 | uVar3) & (uVar5 | 0x3f);
    pgraph_bundle(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,0x48,0,
                  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                  bundle_surf_base_clipid,false);
    pgraph_bundle(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,0x45,0,
                  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                  bundle_surf_limit_clipid,true);
  }
  return;
}

Assistant:

void emulate_mthd() override {
		uint32_t offset_mask = pgraph_offset_mask(&chipset) | 0x3f;
		uint32_t base = (pobj[2] & ~0xfff) | extr(pobj[0], 20, 12);
		uint32_t limit = pobj[1];
		uint32_t dcls = extr(pobj[0], 0, 12);
		int mem = extr(pobj[0], 16, 2);
		bool bad = true;
		if (dcls == 0x30 || dcls == 0x3d)
			bad = false;
		if (extr(exp.debug_d, 23, 1) && bad) {
			nv04_pgraph_blowup(&exp, 0x2);
		}
		bool prot_err = false;
		if (extr(base, 0, 8))
			prot_err = true;
		if (mem >= 2)
			prot_err = true;
		if (mem == 1 && chipset.card_type >= 0x40)
			prot_err = true;
		if (dcls == 0x30) {
			prot_err = false;
		}
		if (prot_err)
			nv04_pgraph_blowup(&exp, 4);
		if (!exp.nsource) {
			exp.bundle_surf_limit_clipid = (limit & offset_mask) | (mem == 1) << 30 | (dcls != 0x30) << 31;
			exp.bundle_surf_base_clipid = base & offset_mask;
			pgraph_bundle(&exp, BUNDLE_SURF_BASE_CLIPID, 0, exp.bundle_surf_base_clipid, false);
			pgraph_bundle(&exp, BUNDLE_SURF_LIMIT_CLIPID, 0, exp.bundle_surf_limit_clipid, true);
		}
	}